

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O2

FFsOptions * __thiscall
level_info_t::GetOptData<FFsOptions>(level_info_t *this,FName *id,bool create)

{
  FOptionalMapinfoDataPtr *pFVar1;
  FOptionalMapinfoData *this_00;
  FName local_28;
  FName local_24;
  
  local_24 = (FName)id->Index;
  pFVar1 = TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
           ::CheckKey(&this->optdata,&local_24);
  if (pFVar1 == (FOptionalMapinfoDataPtr *)0x0) {
    if (create) {
      this_00 = (FOptionalMapinfoData *)operator_new(0x18);
      FFsOptions::FFsOptions((FFsOptions *)this_00);
      _local_28 = CONCAT44(local_24.Index,id->Index);
      pFVar1 = TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
               ::operator[](&this->optdata,&local_28);
      pFVar1->Ptr = this_00;
    }
    else {
      this_00 = (FOptionalMapinfoData *)0x0;
    }
  }
  else {
    this_00 = pFVar1->Ptr;
  }
  return (FFsOptions *)this_00;
}

Assistant:

T *GetOptData(FName id, bool create = true)
	{
		FOptionalMapinfoDataPtr *pdat = optdata.CheckKey(id);
		
		if (pdat != NULL)
		{
			return static_cast<T*>(pdat->Ptr);
		}
		else if (create)
		{
			T *newobj = new T;
			optdata[id].Ptr = newobj;
			return newobj;
		}
		else return NULL;
	}